

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heterogeneous_queue.hpp
# Opt level: O0

type __thiscall
libtorrent::heterogeneous_queue<libtorrent::alert>::
emplace_back<libtorrent::peer_disconnected_alert,libtorrent::aux::stack_allocator&,libtorrent::torrent_handle&,boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>const&,libtorrent::digest32<160l>const&,libtorrent::operation_t_const&,libtorrent::socket_type_t,boost::system::error_code_const&,libtorrent::close_reason_t_const&>
          (heterogeneous_queue<libtorrent::alert> *this,stack_allocator *args,torrent_handle *args_1
          ,basic_endpoint<boost::asio::ip::tcp> *args_2,digest32<160L> *args_3,operation_t *args_4,
          socket_type_t *args_5,error_code *args_6,close_reason_t *args_7)

{
  pointer pcVar1;
  ushort *puVar2;
  size_t sVar3;
  peer_disconnected_alert *this_00;
  size_t sVar4;
  peer_disconnected_alert *ret;
  header_t *hdr;
  size_t pad_bytes;
  char *ptr;
  operation_t *args_local_4;
  digest32<160L> *args_local_3;
  basic_endpoint<boost::asio::ip::tcp> *args_local_2;
  torrent_handle *args_local_1;
  stack_allocator *args_local;
  heterogeneous_queue<libtorrent::alert> *this_local;
  
  if ((ulong)(long)this->m_capacity < (long)this->m_size + 0x90U) {
    grow_capacity(this,0x90);
  }
  pcVar1 = ::std::unique_ptr<char,_libtorrent::aux::free_deleter>::get(&this->m_storage);
  puVar2 = (ushort *)(pcVar1 + this->m_size);
  sVar3 = libtorrent::aux::calculate_pad_bytes((char *)(puVar2 + 8),8);
  *(char *)(puVar2 + 1) = (char)sVar3;
  *(code **)(puVar2 + 4) = move<libtorrent::peer_disconnected_alert>;
  this_00 = (peer_disconnected_alert *)(sVar3 + 0x10 + (long)puVar2);
  sVar4 = libtorrent::aux::calculate_pad_bytes((char *)(this_00 + 1),8);
  *puVar2 = (short)sVar4 + 0x78;
  peer_disconnected_alert::peer_disconnected_alert
            (this_00,args,args_1,args_2,args_3,*args_4,*args_5,args_6,*args_7);
  this->m_num_items = this->m_num_items + 1;
  this->m_size = (int)sVar3 + 0x10 + (uint)*puVar2 + this->m_size;
  return this_00;
}

Assistant:

typename std::enable_if<std::is_base_of<T, U>::value, U&>::type
		emplace_back(Args&&... args)
		{
			// make the conservative assumption that we'll need the maximum padding
			// for this object, just for purposes of growing the storage
			if (std::size_t(m_size) + sizeof(header_t) + alignof(U) + sizeof(U) > std::size_t(m_capacity))
				grow_capacity(sizeof(header_t) + alignof(U) + sizeof(U));

			char* ptr = m_storage.get() + m_size;

			std::size_t const pad_bytes = aux::calculate_pad_bytes(ptr + sizeof(header_t), alignof(U));

			// pad_bytes is only 8 bits in the header, so types that need more than
			// 256 byte alignment may not be supported
			static_assert(alignof(U) <= 256
				, "heterogeneous_queue does not support types with alignment requirements > 256");

#ifdef TORRENT_ADDRESS_SANITIZER
			std::size_t const hdr_len = sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(header_t) + pad_bytes + sizeof(U)
					, alignof(header_t));

			int const new_size = m_size + int(sizeof(header_t) + pad_bytes + hdr_len);

			__sanitizer_annotate_contiguous_container(
				m_storage.get()
				, m_storage.get() + m_capacity
				, ptr
				, m_storage.get() + new_size);
#endif

			// if this assert triggers, the type being added to the queue has
			// alignment requirements stricter than what malloc() returns. This is
			// not supported
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(m_storage.get())
				& (alignof(U) - 1)) == 0);

			// make sure the current position in the storage is aligned for
			// creating a heder_t object
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(header_t) - 1)) == 0);

			// length prefix
			header_t* hdr = new (ptr) header_t;
			hdr->pad_bytes = static_cast<std::uint8_t>(pad_bytes);
			hdr->move = &move<U>;
			ptr += sizeof(header_t) + pad_bytes;
			hdr->len = static_cast<std::uint16_t>(sizeof(U)
				+ aux::calculate_pad_bytes(ptr + sizeof(U), alignof(header_t)));

			// make sure ptr is correctly aligned for the object we're about to
			// create there
			TORRENT_ASSERT((reinterpret_cast<std::uintptr_t>(ptr)
				& (alignof(U) - 1)) == 0);

			// construct in-place
			U* const ret = new (ptr) U(std::forward<Args>(args)...);

			// if we constructed the object without throwing any exception
			// update counters to indicate the new item is in there
			++m_num_items;
			m_size += int(sizeof(header_t) + pad_bytes + hdr->len);
#ifdef TORRENT_ADDRESS_SANITIZER
			TORRENT_ASSERT(m_size == new_size);
#endif
			return *ret;
		}